

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O2

string * cfd::js::api::json::JsonMappingApi::VerifySignature
                   (string *__return_storage_ptr__,string *request_message)

{
  code *local_48 [2];
  code *local_38;
  code *local_30;
  undefined1 local_28 [24];
  code *local_10;
  
  local_28._8_8_ = 0;
  local_28._0_8_ = TransactionStructApi::VerifySignature;
  local_10 = std::
             _Function_handler<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifySignatureRequestStruct_&),_cfd::js::api::VerifySignatureResponseStruct_(*)(const_cfd::js::api::VerifySignatureRequestStruct_&)>
             ::_M_invoke;
  local_28._16_8_ =
       std::
       _Function_handler<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifySignatureRequestStruct_&),_cfd::js::api::VerifySignatureResponseStruct_(*)(const_cfd::js::api::VerifySignatureRequestStruct_&)>
       ::_M_manager;
  local_48[1] = (code *)0x0;
  local_48[0] = ElementsTransactionStructApi::VerifySignature;
  local_30 = std::
             _Function_handler<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifySignatureRequestStruct_&),_cfd::js::api::VerifySignatureResponseStruct_(*)(const_cfd::js::api::VerifySignatureRequestStruct_&)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifySignatureRequestStruct_&),_cfd::js::api::VerifySignatureResponseStruct_(*)(const_cfd::js::api::VerifySignatureRequestStruct_&)>
             ::_M_manager;
  ExecuteElementsCheckApi<cfd::js::api::json::VerifySignatureRequest,cfd::js::api::json::VerifySignatureResponse,cfd::js::api::VerifySignatureRequestStruct,cfd::js::api::VerifySignatureResponseStruct>
            (__return_storage_ptr__,(json *)request_message,(string *)local_28,
             (function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifySignatureRequestStruct_&)>
              *)local_48,
             (function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifySignatureRequestStruct_&)>
              *)ElementsTransactionStructApi::VerifySignature);
  std::_Function_base::~_Function_base((_Function_base *)local_48);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string JsonMappingApi::VerifySignature(
    const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::VerifySignatureRequest, api::json::VerifySignatureResponse,
      api::VerifySignatureRequestStruct, api::VerifySignatureResponseStruct>(
      request_message, TransactionStructApi::VerifySignature,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsTransactionStructApi::VerifySignature);
#else
      TransactionStructApi::VerifySignature);
#endif
}